

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[46],unsigned_int,char,unsigned_int,char[30],unsigned_int,char,unsigned_int,char[21]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [46],uint *Args_1,char *Args_2
          ,uint *Args_3,char (*Args_4) [30],uint *Args_5,char *Args_6,uint *Args_7,
          char (*Args_8) [21])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[46],unsigned_int,char,unsigned_int,char[30],unsigned_int,char,unsigned_int,char[21]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [46])this,(uint *)Args,(char *)Args_1,(uint *)Args_2,(char (*) [30])Args_3,
             (uint *)Args_4,(char *)Args_5,(uint *)Args_6,(char (*) [21])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}